

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_pack(CPUS390XState_conflict *env,uint32_t len,uint64_t dest,uint64_t src)

{
  uint32_t uVar1;
  target_ulong ptr;
  uintptr_t unaff_retaddr;
  undefined1 local_39;
  undefined4 local_38;
  uint uStack_34;
  uint8_t b;
  int len_src;
  int len_dest;
  uintptr_t ra;
  uint64_t src_local;
  uint64_t dest_local;
  uint32_t len_local;
  CPUS390XState_conflict *env_local;
  
  uStack_34 = len >> 4;
  src_local = (long)(int)uStack_34 + dest;
  ptr = (long)(int)(len & 0xf) + src;
  uVar1 = cpu_ldub_data_ra_s390x(env,ptr,unaff_retaddr);
  cpu_stb_data_ra_s390x(env,src_local,(uVar1 & 0xff) << 4 | (int)(uVar1 & 0xff) >> 4,unaff_retaddr);
  ra = ptr - 1;
  local_38 = (len & 0xf) - 1;
  while (0 < (int)uStack_34) {
    local_39 = 0;
    if (-1 < local_38) {
      uVar1 = cpu_ldub_data_ra_s390x(env,ra,unaff_retaddr);
      local_39 = (byte)uVar1 & 0xf;
      ra = ra - 1;
      local_38 = local_38 + -1;
    }
    if (-1 < local_38) {
      uVar1 = cpu_ldub_data_ra_s390x(env,ra,unaff_retaddr);
      local_39 = local_39 | (byte)(uVar1 << 4);
      ra = ra - 1;
      local_38 = local_38 + -1;
    }
    uStack_34 = uStack_34 - 1;
    src_local = src_local - 1;
    cpu_stb_data_ra_s390x(env,src_local,(uint)local_39,unaff_retaddr);
  }
  return;
}

Assistant:

void HELPER(pack)(CPUS390XState *env, uint32_t len, uint64_t dest, uint64_t src)
{
    uintptr_t ra = GETPC();
    int len_dest = len >> 4;
    int len_src = len & 0xf;
    uint8_t b;

    dest += len_dest;
    src += len_src;

    /* last byte is special, it only flips the nibbles */
    b = cpu_ldub_data_ra(env, src, ra);
    cpu_stb_data_ra(env, dest, (b << 4) | (b >> 4), ra);
    src--;
    len_src--;

    /* now pack every value */
    while (len_dest > 0) {
        b = 0;

        if (len_src >= 0) {
            b = cpu_ldub_data_ra(env, src, ra) & 0x0f;
            src--;
            len_src--;
        }
        if (len_src >= 0) {
            b |= cpu_ldub_data_ra(env, src, ra) << 4;
            src--;
            len_src--;
        }

        len_dest--;
        dest--;
        cpu_stb_data_ra(env, dest, b, ra);
    }
}